

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scope.h
# Opt level: O3

void __thiscall Scope::AddNewSymbol(Scope *this,Symbol *sym)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Symbol *this_00;
  
  if (this->scopeType == ScopeType_Global) {
    sym->field_0x42 = sym->field_0x42 | 8;
  }
  sym->scope = this;
  this_00 = this->m_symList;
  do {
    if (this_00 == (Symbol *)0x0) {
LAB_0082bf60:
      sym->next = this->m_symList;
      this->m_symList = sym;
      this->m_count = this->m_count + 1;
      return;
    }
    bVar2 = JsUtil::CharacterBuffer<char16_t>::operator==(&this_00->name,&sym->name);
    if (bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/Scope.h"
                         ,0x96,"(!HasSymbolName(this, sym->GetName()))",
                         "!HasSymbolName(this, sym->GetName())");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
      goto LAB_0082bf60;
    }
    this_00 = this_00->next;
  } while( true );
}

Assistant:

void AddNewSymbol(Symbol *sym)
    {
        if (scopeType == ScopeType_Global)
        {
            sym->SetIsGlobal(true);
        }
        sym->SetScope(this);
        Assert(!HasSymbolName(this, sym->GetName()));
        sym->SetNext(m_symList);
        m_symList = sym;
        m_count++;
    }